

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O3

void __thiscall
duckdb::FixedSizeAllocatorInfo::Serialize(FixedSizeAllocatorInfo *this,Serializer *serializer)

{
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,100,"segment_size",&this->segment_size);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0x65,"buffer_ids",&this->buffer_ids);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::BlockPointer,true>>
            (serializer,0x66,"block_pointers",&this->block_pointers);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0x67,"segment_counts",&this->segment_counts);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0x68,"allocation_sizes",&this->allocation_sizes);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0x69,"buffers_with_free_space",&this->buffers_with_free_space);
  return;
}

Assistant:

void FixedSizeAllocatorInfo::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<idx_t>(100, "segment_size", segment_size);
	serializer.WritePropertyWithDefault<vector<idx_t>>(101, "buffer_ids", buffer_ids);
	serializer.WritePropertyWithDefault<vector<BlockPointer>>(102, "block_pointers", block_pointers);
	serializer.WritePropertyWithDefault<vector<idx_t>>(103, "segment_counts", segment_counts);
	serializer.WritePropertyWithDefault<vector<idx_t>>(104, "allocation_sizes", allocation_sizes);
	serializer.WritePropertyWithDefault<vector<idx_t>>(105, "buffers_with_free_space", buffers_with_free_space);
}